

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu
          (QUnicodeControlCharacterMenu *this,QObject *_editWidget,QWidget *parent)

{
  long lVar1;
  undefined8 in_RDX;
  QWidget *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar2;
  QObject *receiver;
  QString *in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  receiver = in_RDI;
  QMenu::QMenu((QMenu *)in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d20050;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QUnicodeControlCharacterMenu_00d20208;
  *(QWidget **)(in_RDI + 0x28) = in_RSI;
  tr((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),(char *)in_RDI,
     in_stack_ffffffffffffff9c);
  QMenu::setTitle((QMenu *)in_RDI,
                  (QString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QString::~QString((QString *)0x7212ea);
  for (iVar2 = 0; iVar2 < 0xe; iVar2 = iVar2 + 1) {
    tr((char *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),(char *)in_RDI,in_stack_ffffffffffffff9c);
    QWidget::addAction(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,receiver,(char *)in_RSI,
                       (ConnectionType)((ulong)in_RDX >> 0x20));
    QString::~QString((QString *)0x721348);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu(QObject *_editWidget, QWidget *parent)
    : QMenu(parent), editWidget(_editWidget)
{
    setTitle(tr("Insert Unicode control character"));
    for (int i = 0; i < NUM_CONTROL_CHARACTERS; ++i) {
        addAction(tr(qt_controlCharacters[i].text), this, SLOT(menuActionTriggered()));
    }
}